

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O1

void __thiscall chrono::ChBodyAuxRef::ArchiveIN(ChBodyAuxRef *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChFrameMoving<double>_> specFuncA;
  char *local_58;
  undefined ***local_50;
  undefined1 local_48;
  undefined **local_40;
  ChFrameMoving<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::ChBodyAuxRef>(marchive);
  ChBody::ArchiveIN(&this->super_ChBody,marchive);
  local_38 = &this->auxref_to_cog;
  local_40 = &PTR__ChFunctorArchiveIn_00b2dba0;
  local_58 = "auxref_to_cog";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->auxref_to_abs;
  local_40 = &PTR__ChFunctorArchiveIn_00b2dba0;
  local_58 = "auxref_to_abs";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChBodyAuxRef::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChBodyAuxRef>();

    // deserialize parent class
    ChBody::ArchiveIN(marchive);

    // stream in all member data:
    marchive >> CHNVP(auxref_to_cog);
    marchive >> CHNVP(auxref_to_abs);
}